

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O0

int libj1939_set_broadcast(int sock)

{
  uint __errnum;
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  int in_EDI;
  int ret;
  int broadcast;
  undefined4 local_c [2];
  uint local_4;
  
  local_c[0] = 1;
  iVar1 = setsockopt(in_EDI,1,6,local_c,4);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    __stream = _stderr;
    __errnum = -*piVar2;
    pcVar3 = strerror(__errnum);
    fprintf(__stream,"setsockopt(SO_BROADCAST): %d (%s)",(ulong)__errnum,pcVar3);
    local_4 = __errnum;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int libj1939_set_broadcast(int sock)
{
	int broadcast = true;
	int ret;

	ret = setsockopt(sock, SOL_SOCKET, SO_BROADCAST, &broadcast,
			 sizeof(broadcast));
	if (ret < 0) {
		ret = -errno;
		pr_err("setsockopt(SO_BROADCAST): %d (%s)", ret, strerror(ret));
		return ret;
	}

	return 0;
}